

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

bool __thiscall
glslang::HlslParseContext::isScalarConstructor(HlslParseContext *this,TIntermNode *node)

{
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  iVar2 = (*node->_vptr_TIntermNode[0xf])(node);
  if (CONCAT44(extraout_var,iVar2) != 0) {
    iVar2 = (*node->_vptr_TIntermNode[0xf])(node);
    cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x160))
                      ((long *)CONCAT44(extraout_var_00,iVar2));
    if (cVar1 != '\0') {
      iVar2 = (*node->_vptr_TIntermNode[0x12])(node);
      if (CONCAT44(extraout_var_01,iVar2) != 0) {
        iVar2 = (*node->_vptr_TIntermNode[0x12])(node);
        return *(int *)(CONCAT44(extraout_var_02,iVar2) + 0xb8) != 0;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool HlslParseContext::isScalarConstructor(const TIntermNode* node)
{
    // Obviously, it must be a scalar, but an aggregate node might not be fully
    // completed yet: holding a sequence of initializers under an aggregate
    // would not yet be typed, so don't check it's type.  This corresponds to
    // the aggregate operator also not being set yet. (An aggregate operation
    // that legitimately yields a scalar will have a getOp() of that operator,
    // not EOpNull.)

    return node->getAsTyped() != nullptr &&
           node->getAsTyped()->isScalar() &&
           (node->getAsAggregate() == nullptr || node->getAsAggregate()->getOp() != EOpNull);
}